

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O1

HRESULT ChakraRTInterface::ParseConfigFlags(void)

{
  bool bVar1;
  size_t sourceString;
  HRESULT HVar2;
  size_t sourceCount;
  HRESULT unaff_EBX;
  void *in_RDI;
  char **destStringPtr;
  size_t local_28;
  size_t unused;
  char16 *fileNameWide;
  
  if ((m_testHooks.pfSetAssertToConsoleFlag != (SetAssertToConsoleFlagPtr)0x0) && (m_testHooksSetup)
     ) {
    in_RDI = (void *)0x1;
    (*m_testHooks.pfSetAssertToConsoleFlag)(true);
  }
  if (m_testHooks.pfSetConfigFlags != (SetConfigFlagsPtr)0x0) {
    if (m_testHooksSetup != true) {
LAB_0010af42:
      if (m_usageStringPrinted != false) {
        return 0;
      }
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
      return 0;
    }
    in_RDI = (void *)(ulong)(uint)m_argInfo->argc;
    HVar2 = (*m_testHooks.pfSetConfigFlags)
                      (m_argInfo->argc,m_argInfo->argv,
                       &HostConfigFlags::flags.super_ICustomConfigFlags);
    if (HVar2 != 0) goto LAB_0010af42;
  }
  m_argInfo->filename = (char *)0x0;
  if (m_testHooks.pfGetFilenameFlag == (_func_HRESULT_BSTR_ptr *)0x0) {
    ParseConfigFlags();
LAB_0010b02e:
    ParseConfigFlags();
    if (m_testHooksInitialized != false) {
      return 0;
    }
    memcpy(&m_testHooks,in_RDI,0x2a50);
    m_testHooksSetup = true;
    m_testHooksInitialized = true;
    HVar2 = ParseConfigFlags();
    return HVar2;
  }
  unused = 0;
  if ((m_testHooksSetup == true) &&
     (HVar2 = (*m_testHooks.pfGetFilenameFlag)((BSTR *)&unused), sourceString = unused, HVar2 == 0))
  {
    destStringPtr = &m_argInfo->filename;
    sourceCount = PAL_wcslen((char16_t *)unused);
    unaff_EBX = utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                          (utf8::malloc_allocator::allocate,(LPCWSTR)sourceString,sourceCount,
                           destStringPtr,&local_28,(size_t *)0x0);
    in_RDI = (void *)unused;
    SysFreeString((BSTR)unused);
    if (unaff_EBX < 0) {
      if (unaff_EBX != -0x7ff8fff2) goto LAB_0010b02e;
      bVar1 = false;
      PAL_wprintf(L"Error: Ran out of memory");
      goto LAB_0010afba;
    }
  }
  else {
    PAL_wprintf(L"Error: no script file specified.");
    (*m_argInfo->hostPrintUsage)();
    m_usageStringPrinted = true;
  }
  bVar1 = true;
LAB_0010afba:
  if (bVar1) {
    return 0;
  }
  return unaff_EBX;
}

Assistant:

HRESULT ChakraRTInterface::ParseConfigFlags()
{
    HRESULT hr = S_OK;

    if (m_testHooks.pfSetAssertToConsoleFlag)
    {
        SetAssertToConsoleFlag(true);
    }

    if (m_testHooks.pfSetConfigFlags)
    {
        hr = SetConfigFlags(m_argInfo->argc, m_argInfo->argv, &HostConfigFlags::flags);
        if (hr != S_OK && !m_usageStringPrinted)
        {
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
    }

    if (hr == S_OK)
    {
        m_argInfo->filename = nullptr;
        Assert(m_testHooks.pfGetFilenameFlag != nullptr);

        char16* fileNameWide = nullptr;
        hr = GetFileNameFlag(&fileNameWide);

        if (hr != S_OK)
        {
            wprintf(_u("Error: no script file specified."));
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
        else
        {
            hr = WideStringToNarrowDynamic(fileNameWide, &m_argInfo->filename);
            SysFreeString(fileNameWide);
            if (FAILED(hr))
            {
                Assert(hr == E_OUTOFMEMORY);
                wprintf(_u("Error: Ran out of memory"));
                return hr;
            }
        }
    }

    return S_OK;
}